

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_4::(anonymous_namespace)::ApplyS<float,1>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int local_48;
  
  iVar5 = k->v1;
  if (iVar5 != k->v2) {
    fVar1 = k->A;
    local_48 = -iVar5;
    do {
      iVar2 = k->rowlen;
      iVar3 = k->u1;
      iVar7 = (iVar2 - iVar5) - k->w2;
      if (iVar7 < iVar3) {
        iVar7 = iVar3;
      }
      iVar6 = (iVar2 - iVar5) - k->w1;
      if (k->u2 < iVar6) {
        iVar6 = k->u2;
      }
      iVar6 = (iVar6 - iVar7) * nTxChan;
      if (0 < iVar6) {
        fVar10 = (float)iVar7 - k->u;
        fVar9 = (float)iVar5 - k->v;
        fVar11 = fVar10 * k->A * fVar10 + (k->B * fVar10 + k->C * fVar9) * fVar9;
        fVar9 = (fVar10 + fVar10 + 1.0) * k->A + fVar9 * k->B;
        iVar4 = (iVar2 + local_48) - k->w2;
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        pfVar8 = (float *)((long)data + (long)((iVar4 + iVar2 * iVar5) * nTxChan) * 4);
        do {
          if (fVar11 < 1.0) {
            fVar10 = expf(fVar11 * -6.125);
            fVar10 = fVar10 * k->wscale;
            k->weight = k->weight + fVar10;
            *result = fVar10 * *pfVar8 + *result;
          }
          fVar11 = fVar11 + fVar9;
          fVar9 = fVar9 + fVar1 + fVar1;
          pfVar8 = pfVar8 + nTxChan;
        } while (pfVar8 < (float *)((long)data +
                                   (long)iVar6 * 4 + (long)((iVar7 + iVar2 * iVar5) * nTxChan) * 4))
        ;
      }
      iVar5 = iVar5 + 1;
      local_48 = local_48 + -1;
    } while (iVar5 != k->v2);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }